

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O0

int raptor_sockaddr_get_port(raptor_resolved_address *resolved_addr)

{
  short sVar1;
  uint16_t uVar2;
  raptor_sockaddr *addr;
  raptor_resolved_address *resolved_addr_local;
  
  sVar1 = *(short *)resolved_addr->addr;
  if (sVar1 == 1) {
    resolved_addr_local._4_4_ = 1;
  }
  else if (sVar1 == 2) {
    uVar2 = ntohs(*(uint16_t *)(resolved_addr->addr + 2));
    resolved_addr_local._4_4_ = (uint)uVar2;
  }
  else if (sVar1 == 10) {
    uVar2 = ntohs(*(uint16_t *)(resolved_addr->addr + 2));
    resolved_addr_local._4_4_ = (uint)uVar2;
  }
  else {
    raptor::LogFormatPrint
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/socket_util.cc"
               ,0xf1,kLogLevelError,"Unknown socket family %d in raptor_sockaddr_get_port",
               (ulong)*(ushort *)resolved_addr->addr);
    resolved_addr_local._4_4_ = 0;
  }
  return resolved_addr_local._4_4_;
}

Assistant:

int raptor_sockaddr_get_port(const raptor_resolved_address* resolved_addr) {
    const raptor_sockaddr* addr =
        reinterpret_cast<const raptor_sockaddr*>(resolved_addr->addr);
    switch (addr->sa_family) {
    case AF_INET:
        return ntohs(((raptor_sockaddr_in*)addr)->sin_port);
    case AF_INET6:
        return ntohs(((raptor_sockaddr_in6*)addr)->sin6_port);
    case AF_UNIX:  // is unix socket
        return 1;
    default:
        log_error("Unknown socket family %d in raptor_sockaddr_get_port", addr->sa_family);
        return 0;
    }
}